

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NDOLoader.cpp
# Opt level: O3

bool __thiscall
Assimp::NDOImporter::CanRead(NDOImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  int iVar2;
  string extension;
  char *tokens [1];
  string local_48;
  char *local_28;
  
  BaseImporter::GetExtension(&local_48,pFile);
  iVar2 = std::__cxx11::string::compare((char *)&local_48);
  if (iVar2 == 0) {
    bVar1 = true;
  }
  else {
    if (checkSig) {
      if (pIOHandler == (IOSystem *)0x0) {
        bVar1 = false;
        goto LAB_00455d09;
      }
    }
    else {
      bVar1 = false;
      if ((pIOHandler == (IOSystem *)0x0) || (local_48._M_string_length != 0)) goto LAB_00455d09;
    }
    local_28 = "nendo";
    bVar1 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,&local_28,1,5,false,false);
  }
LAB_00455d09:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool NDOImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    // check file extension
    const std::string extension = GetExtension(pFile);

    if( extension == "ndo")
        return true;

    if ((checkSig || !extension.length()) && pIOHandler) {
        const char* tokens[] = {"nendo"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1,5);
    }
    return false;
}